

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint8_t __thiscall Palette::indexOf(Palette *this,uint16_t color)

{
  const_iterator pvVar1;
  const_iterator __last;
  unsigned_short *puVar2;
  uint8_t local_28;
  uint16_t local_12;
  Palette *pPStack_10;
  uint16_t color_local;
  Palette *this_local;
  
  if (color == 0x8000) {
    local_28 = '\0';
  }
  else {
    local_12 = color;
    pPStack_10 = this;
    pvVar1 = begin(this);
    __last = std::array<unsigned_short,_4UL>::end(&this->colors);
    puVar2 = std::find<unsigned_short_const*,unsigned_short>(pvVar1,__last,&local_12);
    pvVar1 = begin(this);
    local_28 = (char)((long)puVar2 - (long)pvVar1 >> 1) + (options.hasTransparentPixels & 1U);
  }
  return local_28;
}

Assistant:

uint8_t Palette::indexOf(uint16_t color) const {
	return color == Rgba::transparent
	           ? 0
	           : std::find(begin(), colors.end(), color) - begin() + options.hasTransparentPixels;
}